

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O0

void exchangeIntMat(char **mat,char *bufIn,char *bufOut,lattice *grid,MPI_Comm Region)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined *in_R8;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int ly;
  int lx;
  MPI_Status st;
  int next;
  int prev;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined1 local_58 [24];
  int local_40;
  int local_3c;
  undefined *local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined8 *local_18;
  
  if (in_R8 != &ompi_mpi_comm_world) {
    iVar1 = *(int *)(in_RCX + 0x20) + 2;
    iVar2 = *(int *)(in_RCX + 0x24) + 2;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    MPI_Cart_shift(in_R8,0,1,&local_3c,&local_40);
    if (-1 < local_3c) {
      MPI_Sendrecv(local_18[1],iVar2,&ompi_mpi_char,local_3c,0x65,*local_18,iVar2,&ompi_mpi_char,
                   local_3c,0x66,local_38,local_58);
    }
    if (-1 < local_40) {
      MPI_Sendrecv(local_18[*(int *)(local_30 + 0x20)],iVar2,&ompi_mpi_char,local_40,0x66,
                   local_18[*(int *)(local_30 + 0x20) + 1],iVar2,&ompi_mpi_char,local_40,0x65,
                   local_38,local_58);
    }
    MPI_Cart_shift(local_38,1,1,&local_3c,&local_40);
    if (-1 < local_3c) {
      for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
        *(undefined1 *)(local_20 + local_64) = *(undefined1 *)(local_18[local_64] + 1);
      }
      MPI_Sendrecv(local_20,iVar1,&ompi_mpi_char,local_3c,0x67,local_28,iVar1,&ompi_mpi_char,
                   local_3c,0x68,local_38,local_58);
      for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
        *(undefined1 *)local_18[local_68] = *(undefined1 *)(local_28 + local_68);
      }
    }
    if (-1 < local_40) {
      for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
        *(undefined1 *)(local_20 + local_6c) =
             *(undefined1 *)(local_18[local_6c] + (long)*(int *)(local_30 + 0x24));
      }
      MPI_Sendrecv(local_20,iVar1,&ompi_mpi_char,local_40,0x68,local_28,iVar1,&ompi_mpi_char,
                   local_40,0x67,local_38,local_58);
      for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
        *(undefined1 *)(local_18[local_70] + (long)(*(int *)(local_30 + 0x24) + 1)) =
             *(undefined1 *)(local_28 + local_70);
      }
    }
  }
  return;
}

Assistant:

void exchangeIntMat (char **mat, char *bufIn, char *bufOut, lattice *grid, MPI_Comm Region)
{
	if (Region == MPI_COMM_WORLD)
		return;
	int prev, next;
	MPI_Status st;
	int lx = grid->deli+2;
	int ly = grid->delj+2;
	/* Left and right */
	MPI_Cart_shift(Region,0,1,&prev,&next);
	if (prev >= 0)
		MPI_Sendrecv(mat[1],ly,MPI_CHAR,prev,101,mat[0],ly,MPI_CHAR,prev,102,Region,&st);
	if (next >= 0)
		MPI_Sendrecv(mat[grid->deli],ly,MPI_CHAR,next,102,mat[grid->deli+1],ly,MPI_CHAR,next,101,Region,&st);
	/* Up and Down */
	MPI_Cart_shift(Region,1,1,&prev,&next);
	if (prev >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][1];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,prev,103,bufOut,lx,MPI_CHAR,prev,104,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][0] = bufOut[i];
	}
	if (next >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][grid->delj];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,next,104,bufOut,lx,MPI_CHAR,next,103,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][grid->delj+1] = bufOut[i];
	}
	return;
}